

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCutUtils.c
# Opt level: O0

void Map_CutListRecycle(Map_Man_t *p,Map_Cut_t *pSetList,Map_Cut_t *pSave)

{
  Map_Cut_t *local_40;
  Map_Cut_t *local_38;
  Map_Cut_t *local_30;
  Map_Cut_t *pTemp;
  Map_Cut_t *pNext;
  Map_Cut_t *pSave_local;
  Map_Cut_t *pSetList_local;
  Map_Man_t *p_local;
  
  if (pSetList == (Map_Cut_t *)0x0) {
    local_38 = (Map_Cut_t *)0x0;
  }
  else {
    local_38 = pSetList->pNext;
  }
  pTemp = local_38;
  local_30 = pSetList;
  while (local_30 != (Map_Cut_t *)0x0) {
    if (local_30 != pSave) {
      Extra_MmFixedEntryRecycle(p->mmCuts,(char *)local_30);
    }
    local_30 = pTemp;
    if (pTemp == (Map_Cut_t *)0x0) {
      local_40 = (Map_Cut_t *)0x0;
    }
    else {
      local_40 = pTemp->pNext;
    }
    pTemp = local_40;
  }
  return;
}

Assistant:

void Map_CutListRecycle( Map_Man_t * p, Map_Cut_t * pSetList, Map_Cut_t * pSave )
{
    Map_Cut_t * pNext, * pTemp;
    for ( pTemp = pSetList, pNext = pTemp? pTemp->pNext : NULL; 
          pTemp; 
          pTemp = pNext, pNext = pNext? pNext->pNext : NULL )
        if ( pTemp != pSave )
            Extra_MmFixedEntryRecycle( p->mmCuts, (char *)pTemp );
}